

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorShower::rgbEd(QColorShower *this)

{
  QRgb _t1;
  int g;
  int b;
  int a;
  QRgb QVar1;
  QColorShower *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QColSpinBox *in_stack_ffffffffffffffa8;
  QColorShower *this_00;
  int *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  QRgb rgb;
  QColorShower *this_01;
  undefined1 local_30 [40];
  long local_8;
  
  rgb = (QRgb)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->rgbOriginal = true;
  _t1 = QSpinBox::value((QSpinBox *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  g = QSpinBox::value((QSpinBox *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  b = QSpinBox::value((QSpinBox *)CONCAT44(in_stack_ffffffffffffffa4,g));
  a = currentAlpha((QColorShower *)CONCAT44(b,g));
  QVar1 = qRgba(_t1,g,b,a);
  in_RDI->curCol = QVar1;
  currentColor(in_RDI);
  rgb2hsv(rgb,in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8,(int *)CONCAT44(b,g));
  QColSpinBox::setValue(in_stack_ffffffffffffffa8,b);
  QColSpinBox::setValue(in_stack_ffffffffffffffa8,b);
  QColSpinBox::setValue(in_stack_ffffffffffffffa8,b);
  this_00 = (QColorShower *)(local_30 + 0x18);
  QColor::QColor((QColor *)this_00,in_RDI->curCol);
  this_01 = (QColorShower *)local_30;
  QColor::name((NameFormat)this_01);
  QLineEdit::setText((QLineEdit *)CONCAT44(b,g),(QString *)CONCAT44(_t1,in_stack_ffffffffffffff98));
  QString::~QString((QString *)0x736080);
  showCurrentColor(this_00);
  currentColor(in_RDI);
  newCol((QColorShower *)0x7360a0,_t1);
  updateQColor(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::rgbEd()
{
    rgbOriginal = true;
    curCol = qRgba(rEd->value(), gEd->value(), bEd->value(), currentAlpha());

    rgb2hsv(currentColor(), hue, sat, val);

    hEd->setValue(hue);
    sEd->setValue(sat);
    vEd->setValue(val);

    htEd->setText(QColor(curCol).name());

    showCurrentColor();
    emit newCol(currentColor());
    updateQColor();
}